

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::HttpServer::Connection::~Connection(Connection *this)

{
  uint *puVar1;
  HttpServer *pHVar2;
  PromiseFulfiller<void> *pPVar3;
  undefined1 local_11;
  
  pHVar2 = this->server;
  puVar1 = &pHVar2->connectionCount;
  *puVar1 = *puVar1 - 1;
  if ((*puVar1 == 0) &&
     (pPVar3 = (pHVar2->zeroConnectionsFulfiller).ptr.ptr, pPVar3 != (PromiseFulfiller<void> *)0x0))
  {
    (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,&local_11);
  }
  _::NullableValue<kj::Promise<bool>_>::~NullableValue(&(this->webSocketError).ptr);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&(this->httpOutput).writeQueue);
  anon_unknown_31::HttpInputStreamImpl::~HttpInputStreamImpl(&this->httpInput);
  return;
}

Assistant:

~Connection() noexcept(false) {
    if (--server.connectionCount == 0) {
      KJ_IF_MAYBE(f, server.zeroConnectionsFulfiller) {
        f->get()->fulfill();
      }
    }
  }